

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_deconstruction.h
# Opt level: O3

CalAdxl345BusData * __thiscall
ximu::PacketDeconstruction::
deconstructCalAdxl345BusData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CalAdxl345BusData *__return_storage_ptr__,PacketDeconstruction *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = FixedFloat::toFloat((char)this[1],(char)this[2],CALIBRATED_ADXL_345);
  fVar2 = FixedFloat::toFloat((char)this[3],(char)this[4],CALIBRATED_ADXL_345);
  fVar3 = FixedFloat::toFloat((char)this[5],(char)this[6],CALIBRATED_ADXL_345);
  fVar4 = FixedFloat::toFloat((char)this[7],(char)this[8],CALIBRATED_ADXL_345);
  fVar5 = FixedFloat::toFloat((char)this[9],(char)this[10],CALIBRATED_ADXL_345);
  fVar6 = FixedFloat::toFloat((char)this[0xb],(char)this[0xc],CALIBRATED_ADXL_345);
  fVar7 = FixedFloat::toFloat((char)this[0xd],(char)this[0xe],CALIBRATED_ADXL_345);
  fVar8 = FixedFloat::toFloat((char)this[0xf],(char)this[0x10],CALIBRATED_ADXL_345);
  fVar9 = FixedFloat::toFloat((char)this[0x11],(char)this[0x12],CALIBRATED_ADXL_345);
  fVar10 = FixedFloat::toFloat((char)this[0x13],(char)this[0x14],CALIBRATED_ADXL_345);
  fVar11 = FixedFloat::toFloat((char)this[0x15],(char)this[0x16],CALIBRATED_ADXL_345);
  fVar12 = FixedFloat::toFloat((char)this[0x17],(char)this[0x18],CALIBRATED_ADXL_345);
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelA._x = fVar1;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelA._y = fVar2;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelA._z = fVar3;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelB._x = fVar4;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelB._y = fVar5;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelB._z = fVar6;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelC._x = fVar7;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelC._y = fVar8;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelC._z = fVar9;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelD._x = fVar10;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelD._y = fVar11;
  (__return_storage_ptr__->super_FourChannelData<ximu::Vector3<float>_>)._channelD._z = fVar12;
  return __return_storage_ptr__;
}

Assistant:

static CalAdxl345BusData deconstructCalAdxl345BusData(
    InputIterator begin, InputIterator end)
  {
    return CalAdxl345BusData(
      Vector3f(
	FixedFloat::toFloat(begin[1],begin[2],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[3],begin[4],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[5],begin[6],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[7],begin[8],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[9],begin[10],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[11],begin[12],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[13],begin[14],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[15],begin[16],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[17],begin[18],Qvals::CALIBRATED_ADXL_345)
      ),
      
      Vector3f(
	FixedFloat::toFloat(begin[19],begin[20],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[21],begin[22],Qvals::CALIBRATED_ADXL_345),
	FixedFloat::toFloat(begin[23],begin[24],Qvals::CALIBRATED_ADXL_345)
      )
    );
  }